

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void cimg_library::CImgDisplay::_render_resize<unsigned_char,unsigned_char>
               (uchar *ptrs,uint ws,uint hs,uchar *ptrd,uint wd,uint hd)

{
  uint uVar1;
  void *pvVar2;
  uint *puVar3;
  uint uVar4;
  uchar *puVar5;
  uint *puVar6;
  long lVar7;
  ulong __n;
  float fVar8;
  float fVar9;
  
  __n = (ulong)wd;
  pvVar2 = operator_new__(__n * 4);
  puVar3 = (uint *)operator_new__((ulong)(hd + 1) << 2);
  if (wd != 0) {
    lVar7 = 0;
    fVar8 = 0.0;
    do {
      fVar9 = (float)ws / (float)__n + fVar8;
      *(int *)((long)pvVar2 + lVar7 * 4) = (int)(long)fVar9 - (int)(long)fVar8;
      lVar7 = lVar7 + 1;
      fVar8 = fVar9;
    } while (wd != (uint)lVar7);
  }
  puVar6 = puVar3;
  if (hd != 0) {
    fVar8 = 0.0;
    uVar4 = hd;
    do {
      fVar9 = (float)hs / (float)hd + fVar8;
      *puVar6 = ((int)(long)fVar9 - (int)(long)fVar8) * ws;
      puVar6 = puVar6 + 1;
      uVar4 = uVar4 - 1;
      fVar8 = fVar9;
    } while (uVar4 != 0);
  }
  *puVar6 = 0;
  if (hd != 0) {
    uVar4 = 0;
    puVar6 = puVar3;
    do {
      if (wd != 0) {
        lVar7 = 0;
        puVar5 = ptrs;
        do {
          ptrd[lVar7] = *puVar5;
          puVar5 = puVar5 + *(uint *)((long)pvVar2 + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (wd != (uint)lVar7);
        ptrd = ptrd + lVar7;
      }
      while( true ) {
        uVar1 = *puVar6;
        puVar6 = puVar6 + 1;
        uVar4 = uVar4 + 1;
        if ((uVar1 != 0) || (hd <= uVar4)) break;
        memcpy(ptrd,ptrd + -__n,__n);
        ptrd = ptrd + __n;
      }
      ptrs = ptrs + uVar1;
    } while (uVar4 < hd);
  }
  operator_delete__(pvVar2);
  operator_delete__(puVar3);
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      unsigned int *const offx = new unsigned int[wd], *const offy = new unsigned int[hd+1], *poffx, *poffy;
      float s, curr, old;
      s = (float)ws/wd;
      poffx = offx; curr = 0; for (unsigned int x = 0; x<wd; ++x) { old = curr; curr+=s; *(poffx++) = (unsigned int)curr - (unsigned int)old; }
      s = (float)hs/hd;
      poffy = offy; curr = 0; for (unsigned int y = 0; y<hd; ++y) { old = curr; curr+=s; *(poffy++) = ws*((unsigned int)curr - (unsigned int)old); }
      *poffy = 0;
      poffy = offy;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        poffx = offx;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poffx++); }
        ++y;
        unsigned int dy = *(poffy++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poffy++)) {}
        ptrs+=dy;
      }
      delete[] offx; delete[] offy;
    }